

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

string * __thiscall
boost::deflate::inflate_stream_test::compress_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,string_view *in,int level,
          int windowBits,wrap wrap,int memLevel,int strategy)

{
  int iVar1;
  logic_error *plVar2;
  size_type sVar3;
  undefined7 in_register_00000089;
  undefined1 auStack_98 [4];
  int result;
  z_stream zs;
  int memLevel_local;
  wrap wrap_local;
  int windowBits_local;
  int level_local;
  string_view *in_local;
  string *out;
  
  zs.reserved._7_1_ = (char)windowBits;
  zs.reserved._0_4_ = (int)CONCAT71(in_register_00000089,wrap);
  if (zs.reserved._7_1_ == '\0') {
    memLevel_local = -level;
  }
  else {
    memLevel_local = level;
    if (zs.reserved._7_1_ == '\x02') {
      memLevel_local = level + 0x10;
    }
  }
  memset(auStack_98,0,0x70);
  iVar1 = deflateInit2_((z_streamp)auStack_98,(int)in,8,memLevel_local,(int)zs.reserved,memLevel,
                        "1.2.11",0x70);
  if (iVar1 != 0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"deflateInit2 failed");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  _auStack_98 = (Bytef *)basic_string_view<char,_std::char_traits<char>_>::data
                                   ((basic_string_view<char,_std::char_traits<char>_> *)this);
  sVar3 = basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  zs.next_in._0_4_ = (undefined4)sVar3;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar3 = basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  deflateBound((z_streamp)auStack_98,sVar3);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  _auStack_98 = (Bytef *)basic_string_view<char,_std::char_traits<char>_>::data
                                   ((basic_string_view<char,_std::char_traits<char>_> *)this);
  sVar3 = basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  zs.next_in._0_4_ = (undefined4)sVar3;
  zs.total_in = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  zs.next_out._0_4_ = std::__cxx11::string::size();
  iVar1 = ::deflate((z_streamp)auStack_98,3);
  if (iVar1 != 0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"deflate failed");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  deflateEnd((z_streamp)auStack_98);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string compress(
        string_view const& in,
        int level,                  // 0=none, 1..9, -1=default
        int windowBits,             // 9..15
        wrap wrap,                  // stream wrapper
        int memLevel,               // 1..9 (8=default)
        int strategy)               // e.g. Z_DEFAULT_STRATEGY
    {
        switch (wrap) {
            case boost::deflate::wrap::none:
                windowBits *= -1;
                break;
            case boost::deflate::wrap::gzip:
                windowBits += 16;
            default:
                ;
        }
        z_stream zs;
        memset(&zs, 0, sizeof(zs));
        int result = deflateInit2(
            &zs,
            level,
            Z_DEFLATED,
            windowBits,
            memLevel,
            strategy);
        if(result != Z_OK)
            throw std::logic_error{"deflateInit2 failed"};
        zs.next_in = (Bytef*)in.data();
        zs.avail_in = static_cast<uInt>(in.size());
        std::string out;
        out.resize(deflateBound(&zs,
            static_cast<uLong>(in.size())));
        zs.next_in = (Bytef*)in.data();
        zs.avail_in = static_cast<uInt>(in.size());
        zs.next_out = (Bytef*)&out[0];
        zs.avail_out = static_cast<uInt>(out.size());
        result = ::deflate(&zs, Z_FULL_FLUSH);
        if(result != Z_OK)
            throw std::logic_error("deflate failed");
        out.resize(zs.total_out);
        deflateEnd(&zs);
        return out;
    }